

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O3

void ptrobj_bang(t_ptrobj *x)

{
  t_gpointer *gp;
  int iVar1;
  t_symbol *ptVar2;
  _outlet **pp_Var3;
  _outlet *x_00;
  
  gp = &x->x_gp;
  iVar1 = gpointer_check(gp,1);
  if (iVar1 == 0) {
    pd_error(x,"pointer bang: empty pointer");
    return;
  }
  ptVar2 = gpointer_gettemplatesym(gp);
  iVar1 = x->x_ntypedout;
  if (iVar1 != 0) {
    pp_Var3 = &x->x_typedout->to_outlet;
    do {
      if (((t_typedout *)(pp_Var3 + -1))->to_type == ptVar2) {
        x_00 = *pp_Var3;
        goto LAB_00163cab;
      }
      pp_Var3 = pp_Var3 + 2;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  x_00 = x->x_otherout;
LAB_00163cab:
  outlet_pointer(x_00,gp);
  return;
}

Assistant:

static void ptrobj_bang(t_ptrobj *x)
{
    t_symbol *templatesym;
    int n;
    t_typedout *to;
    if (!gpointer_check(&x->x_gp, 1))
    {
        pd_error(x, "pointer bang: empty pointer");
        return;
    }
    templatesym = gpointer_gettemplatesym(&x->x_gp);
    for (n = x->x_ntypedout, to = x->x_typedout; n--; to++)
    {
        if (to->to_type == templatesym)
        {
            outlet_pointer(to->to_outlet, &x->x_gp);
            return;
        }
    }
    outlet_pointer(x->x_otherout, &x->x_gp);
}